

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vlog_is_on.cc
# Opt level: O0

int google::SetVLOGLevel(char *module_pattern,int log_level)

{
  bool bVar1;
  size_t patt_len;
  char *pattern;
  size_t patt_len_00;
  VModuleInfo *this;
  bool local_7a;
  int32 *piStack_60;
  int32 verbose_level__;
  SiteFlag *item;
  SiteFlag **item_ptr;
  VModuleInfo *info_1;
  VModuleInfo *local_38;
  VModuleInfo *info;
  lock_guard<std::mutex> l;
  bool found;
  size_t pattern_len;
  int result;
  int log_level_local;
  char *module_pattern_local;
  
  pattern_len._0_4_ = fLI::FLAGS_v;
  patt_len = strlen(module_pattern);
  l._M_device._7_1_ = 0;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&info,(mutex_type *)vmodule_mutex);
  for (local_38 = vmodule_list; local_38 != (VModuleInfo *)0x0; local_38 = local_38->next) {
    bVar1 = std::operator==(&local_38->module_pattern,module_pattern);
    if (bVar1) {
      if ((l._M_device._7_1_ & 1) == 0) {
        pattern_len._0_4_ = local_38->vlog_level;
        l._M_device._7_1_ = 1;
      }
      local_38->vlog_level = log_level;
    }
    else if ((l._M_device._7_1_ & 1) == 0) {
      pattern = (char *)std::__cxx11::string::c_str();
      patt_len_00 = std::__cxx11::string::size();
      bVar1 = glog_internal_namespace_::SafeFNMatch_(pattern,patt_len_00,module_pattern,patt_len);
      if (bVar1) {
        pattern_len._0_4_ = local_38->vlog_level;
        l._M_device._7_1_ = 1;
      }
    }
  }
  if ((l._M_device._7_1_ & 1) == 0) {
    this = (VModuleInfo *)operator_new(0x30);
    VModuleInfo::VModuleInfo(this);
    std::__cxx11::string::operator=((string *)this,module_pattern);
    this->vlog_level = log_level;
    this->next = vmodule_list;
    item = (SiteFlag *)&cached_site_list;
    piStack_60 = cached_site_list;
    vmodule_list = this;
    while (piStack_60 != (int32 *)0x0) {
      bVar1 = glog_internal_namespace_::SafeFNMatch_
                        (module_pattern,patt_len,*(char **)(piStack_60 + 2),
                         *(size_t *)(piStack_60 + 4));
      if (bVar1) {
        *(int32 **)piStack_60 = &this->vlog_level;
        item->level = *(int32 **)(piStack_60 + 6);
      }
      else {
        item = (SiteFlag *)(piStack_60 + 6);
      }
      piStack_60 = item->level;
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&info);
  if (SetVLOGLevel::vlocal__.level == (int32 *)0x0) {
    local_7a = InitVLOG3__(&SetVLOGLevel::vlocal__,&fLI::FLAGS_v,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/vlog_is_on.cc"
                           ,1);
  }
  else {
    local_7a = 0 < *SetVLOGLevel::vlocal__.level;
  }
  if (local_7a != false) {
    RawLog__(GLOG_INFO,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/vlog_is_on.cc"
             ,199,"Set VLOG level for \"%s\" to %d",module_pattern,(ulong)(uint)log_level);
  }
  return (int)pattern_len;
}

Assistant:

int SetVLOGLevel(const char* module_pattern, int log_level) {
  int result = FLAGS_v;
  size_t const pattern_len = strlen(module_pattern);
  bool found = false;
  {
    std::lock_guard<std::mutex> l(
        vmodule_mutex);  // protect whole read-modify-write
    for (const VModuleInfo* info = vmodule_list; info != nullptr;
         info = info->next) {
      if (info->module_pattern == module_pattern) {
        if (!found) {
          result = info->vlog_level;
          found = true;
        }
        info->vlog_level = log_level;
      } else if (!found && SafeFNMatch_(info->module_pattern.c_str(),
                                        info->module_pattern.size(),
                                        module_pattern, pattern_len)) {
        result = info->vlog_level;
        found = true;
      }
    }
    if (!found) {
      auto* info = new VModuleInfo;
      info->module_pattern = module_pattern;
      info->vlog_level = log_level;
      info->next = vmodule_list;
      vmodule_list = info;

      SiteFlag** item_ptr = &cached_site_list;
      SiteFlag* item = cached_site_list;

      // We traverse the list fully because the pattern can match several items
      // from the list.
      while (item) {
        if (SafeFNMatch_(module_pattern, pattern_len, item->base_name,
                         item->base_len)) {
          // Redirect the cached value to its module override.
          item->level = &info->vlog_level;
          *item_ptr = item->next;  // Remove the item from the list.
        } else {
          item_ptr = &item->next;
        }
        item = *item_ptr;
      }
    }
  }
  RAW_VLOG(1, "Set VLOG level for \"%s\" to %d", module_pattern, log_level);
  return result;
}